

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O1

size_t qHash(double key,size_t seed)

{
  ulong uVar1;
  
  uVar1 = (ulong)(key + 0.0) ^ seed;
  uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
  uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
  return uVar1 >> 0x20 ^ uVar1;
}

Assistant:

size_t qHash(double key, size_t seed) noexcept
{
    // ensure -0 gets mapped to 0
    key += 0.0;
    if constexpr (sizeof(double) == sizeof(size_t)) {
        size_t k;
        memcpy(&k, &key, sizeof(double));
        return QHashPrivate::hash(k, seed);
    } else {
        return murmurhash(&key, sizeof(key), seed);
    }
}